

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::Config_testZeroSamplingParam_Test::TestBody(Config_testZeroSamplingParam_Test *this)

{
  char cVar1;
  element_type *peVar2;
  AssertionResult gtest_ar;
  Config config;
  long *local_1d8;
  int local_1d0 [2];
  Node local_1c8;
  Config local_1a8;
  
  YAML::Load(&local_1c8.m_isValid);
  Config::parse(&local_1a8,&local_1c8);
  if (local_1c8.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1d0[0] = 0;
  local_1d8 = (long *)local_1a8._sampler._param;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_1c8,"0","config.sampler().param()",local_1d0,(double *)&local_1d8);
  if (local_1c8.m_isValid == false) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1c8.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      peVar2 = (element_type *)0x1fd4e1;
    }
    else {
      peVar2 = ((local_1c8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_pMemory).super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/ConfigTest.cpp"
               ,0x5f,(char *)peVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d0);
    if (local_1d8 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_1d8 != (long *)0x0)) {
        (**(code **)(*local_1d8 + 8))();
      }
      local_1d8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1c8.m_pMemory,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Config::~Config(&local_1a8);
  return;
}

Assistant:

TEST(Config, testZeroSamplingParam)
{
    {
        constexpr auto kConfigYAML = R"cfg(
sampler:
    param: 0
)cfg";
        const auto config = Config::parse(YAML::Load(kConfigYAML));
        ASSERT_EQ(0, config.sampler().param());
    }
}